

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O1

pair<int,_bool> __thiscall
cmComputeLinkDepends::AddLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item,int groupIndex)

{
  iterator *piVar1;
  pointer pcVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  cmGeneratorTarget *pcVar3;
  char *pcVar4;
  _Elt_pointer pBVar5;
  size_type sVar6;
  bool bVar7;
  element_type *peVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  EntryKind EVar10;
  int iVar11;
  string *psVar12;
  cmValue cVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Rb_tree_color _Var14;
  ulong uVar15;
  pointer this_01;
  bool bVar16;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar17;
  basic_string_view<char,_std::char_traits<char>_> __str;
  BFSEntry qe;
  string var;
  BFSEntry local_c8;
  long local_b8;
  char *pcStack_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  long *local_98;
  char *local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  undefined8 uStack_80;
  long local_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  pVar17 = AllocateLinkEntry(this,item);
  if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    _Var14 = pVar17.first._M_node._M_node[3]._M_color;
    uVar15 = 0;
    goto LAB_004d7850;
  }
  _Var14 = pVar17.first._M_node._M_node[3]._M_color;
  local_78 = (long)(int)_Var14;
  this_01 = (this->EntryList).
            super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
            ._M_impl.super__Vector_impl_data._M_start + local_78;
  psVar12 = cmLinkItem::AsStr_abi_cxx11_(item);
  pcVar2 = (psVar12->_M_dataplus)._M_p;
  local_98 = (long *)&local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + psVar12->_M_string_length);
  local_a8 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  p_Stack_a0 = (item->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
               .
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Stack_a0->_M_use_count = p_Stack_a0->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Stack_a0->_M_use_count = p_Stack_a0->_M_use_count + 1;
    }
  }
  if (local_98 == (long *)&local_88) {
    pcStack_b0 = (char *)uStack_80;
    local_c8._0_8_ = &local_b8;
  }
  else {
    local_c8._0_8_ = local_98;
  }
  local_b8 = CONCAT71(uStack_87,local_88);
  local_c8.LibDepends = local_90;
  local_90 = (char *)0x0;
  local_88 = 0;
  local_98 = (long *)&local_88;
  std::__cxx11::string::operator=((string *)this_01,(string *)&local_c8);
  p_Var9 = p_Stack_a0;
  peVar8 = local_a8;
  local_a8 = (element_type *)0x0;
  p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            ((long)&(this_01->Item).Backtrace.
                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))->_M_pi;
  (this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar8;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(this_01->Item).Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace> + 8))
  ->_M_pi = p_Var9;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
  }
  if ((long *)local_c8._0_8_ != &local_b8) {
    operator_delete((void *)local_c8._0_8_,local_b8 + 1);
  }
  if (local_98 != (long *)&local_88) {
    operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
  }
  pcVar3 = item->Target;
  this_01->Target = pcVar3;
  if (((pcVar3 == (cmGeneratorTarget *)0x0) &&
      (pcVar4 = (this_01->Item).Value._M_dataplus._M_p, *pcVar4 == '-')) && (pcVar4[1] != 'l')) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)this_01);
    iVar11 = std::__cxx11::string::compare((char *)local_50);
    bVar16 = iVar11 != 0;
    bVar7 = true;
  }
  else {
    bVar7 = false;
    bVar16 = false;
  }
  if ((bVar7) && (local_50[0] != local_40)) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  EVar10 = Flag;
  if (bVar16) {
LAB_004d765b:
    this_01->Kind = EVar10;
  }
  else {
    local_c8.LibDepends = (this_01->Item).Value._M_dataplus._M_p;
    local_c8._0_8_ = (this_01->Item).Value._M_string_length;
    __str._M_str = DAT_009d69e8;
    __str._M_len = (anonymous_namespace)::LG_BEGIN;
    iVar11 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                       ((basic_string_view<char,_std::char_traits<char>_> *)&local_c8,0,
                        (anonymous_namespace)::LG_BEGIN,__str);
    if (((iVar11 == 0) && (sVar6 = (this_01->Item).Value._M_string_length, sVar6 != 0)) &&
       (EVar10 = Group, *(char *)(*(long *)&(this_01->Item).Value._M_dataplus + -1 + sVar6) == '>'))
    goto LAB_004d765b;
  }
  uVar15 = 0x100000000;
  if (this_01->Kind != Group) {
    if (this_01->Target == (cmGeneratorTarget *)0x0) {
      local_c8.LibDepends = (this_01->Item).Value._M_dataplus._M_p;
      local_c8._0_8_ = (this_01->Item).Value._M_string_length;
      local_b8 = 0xc;
      pcStack_b0 = "_LIB_DEPENDS";
      views._M_len = 2;
      views._M_array = (iterator)&local_c8;
      cmCatViews_abi_cxx11_(&local_70,views);
      cVar13 = cmMakefile::GetDefinition(this->Makefile,&local_70);
      if (cVar13.Value == (string *)0x0) {
        if (this_01->Kind != Flag) {
          (this->InferredDependSets).
          super__Vector_base<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
          ._M_impl.super__Vector_impl_data._M_start[local_78].Initialized = true;
        }
      }
      else {
        local_c8.GroupIndex = groupIndex;
        local_c8.Index = _Var14;
        local_c8.LibDepends = ((cVar13.Value)->_M_dataplus)._M_p;
        pBVar5 = (this->BFSQueue).c.
                 super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pBVar5 == (this->BFSQueue).c.
                      super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
          ::_M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                    ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                      *)&this->BFSQueue,&local_c8);
        }
        else {
          pBVar5->Index = _Var14;
          pBVar5->GroupIndex = groupIndex;
          pBVar5->LibDepends = local_c8.LibDepends;
          piVar1 = &(this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish;
          piVar1->_M_cur = piVar1->_M_cur + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_c8.GroupIndex = groupIndex;
      local_c8.Index = _Var14;
      local_c8.LibDepends = (char *)0x0;
      pBVar5 = (this->BFSQueue).c.
               super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pBVar5 == (this->BFSQueue).c.
                    super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>::
        _M_push_back_aux<cmComputeLinkDepends::BFSEntry_const&>
                  ((deque<cmComputeLinkDepends::BFSEntry,std::allocator<cmComputeLinkDepends::BFSEntry>>
                    *)&this->BFSQueue,&local_c8);
      }
      else {
        pBVar5->Index = _Var14;
        pBVar5->GroupIndex = groupIndex;
        pBVar5->LibDepends = (char *)0x0;
        piVar1 = &(this->BFSQueue).c.
                  super__Deque_base<cmComputeLinkDepends::BFSEntry,_std::allocator<cmComputeLinkDepends::BFSEntry>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
    }
  }
LAB_004d7850:
  return (pair<int,_bool>)(_Var14 | uVar15);
}

Assistant:

std::pair<int, bool> cmComputeLinkDepends::AddLinkEntry(cmLinkItem const& item,
                                                        int groupIndex)
{
  // Allocate a spot for the item entry.
  auto lei = this->AllocateLinkEntry(item);

  // Check if the item entry has already been added.
  if (!lei.second) {
    // Yes.  We do not need to follow the item's dependencies again.
    return { lei.first->second, false };
  }

  // Initialize the item entry.
  int index = lei.first->second;
  LinkEntry& entry = this->EntryList[index];
  entry.Item = BT<std::string>(item.AsStr(), item.Backtrace);
  entry.Target = item.Target;
  if (!entry.Target && entry.Item.Value[0] == '-' &&
      entry.Item.Value[1] != 'l' &&
      entry.Item.Value.substr(0, 10) != "-framework") {
    entry.Kind = LinkEntry::Flag;
  } else if (cmHasPrefix(entry.Item.Value, LG_BEGIN) &&
             cmHasSuffix(entry.Item.Value, '>')) {
    entry.Kind = LinkEntry::Group;
  }

  if (entry.Kind != LinkEntry::Group) {
    // If the item has dependencies queue it to follow them.
    if (entry.Target) {
      // Target dependencies are always known.  Follow them.
      BFSEntry qe = { index, groupIndex, nullptr };
      this->BFSQueue.push(qe);
    } else {
      // Look for an old-style <item>_LIB_DEPENDS variable.
      std::string var = cmStrCat(entry.Item.Value, "_LIB_DEPENDS");
      if (cmValue val = this->Makefile->GetDefinition(var)) {
        // The item dependencies are known.  Follow them.
        BFSEntry qe = { index, groupIndex, val->c_str() };
        this->BFSQueue.push(qe);
      } else if (entry.Kind != LinkEntry::Flag) {
        // The item dependencies are not known.  We need to infer them.
        this->InferredDependSets[index].Initialized = true;
      }
    }
  }

  return { index, true };
}